

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_bitset_container_intersection
                (bitset_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  int size;
  bitset_container_t *dst_00;
  array_container_t *paVar1;
  
  size = bitset_container_and_justcard(src_1,src_2);
  if (size < 0x1001) {
    paVar1 = array_container_create_given_capacity(size);
    *dst = paVar1;
    if (paVar1 != (array_container_t *)0x0) {
      paVar1->cardinality = size;
      bitset_extract_intersection_setbits_uint16(src_1->words,src_2->words,0x400,paVar1->array,0);
    }
  }
  else {
    dst_00 = bitset_container_create();
    *dst = dst_00;
    if (dst_00 != (bitset_container_t *)0x0) {
      bitset_container_and_nocard(src_1,src_2,dst_00);
      *(int *)*dst = size;
    }
  }
  return 0x1000 < size;
}

Assistant:

bool bitset_bitset_container_intersection(
    const bitset_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    const int newCardinality = bitset_container_and_justcard(src_1, src_2);
    if (newCardinality > DEFAULT_MAX_SIZE) {
        *dst = bitset_container_create();
        if (*dst != NULL) {
            bitset_container_and_nocard(src_1, src_2, CAST_bitset(*dst));
            CAST_bitset(*dst)->cardinality = newCardinality;
        }
        return true;  // it is a bitset
    }
    *dst = array_container_create_given_capacity(newCardinality);
    if (*dst != NULL) {
        CAST_array(*dst)->cardinality = newCardinality;
        bitset_extract_intersection_setbits_uint16(
            src_1->words, src_2->words, BITSET_CONTAINER_SIZE_IN_WORDS,
            CAST_array(*dst)->array, 0);
    }
    return false;  // not a bitset
}